

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_scatterplot.cpp
# Opt level: O2

Reals Omega_h::get_linear_scatter_coords<3>(Reals coords,Vector<3> direction,Vector<3> origin)

{
  Alloc *pAVar1;
  Int i;
  int size_in;
  long lVar2;
  void *extraout_RDX;
  size_t sVar3;
  double dVar4;
  Reals RVar5;
  allocator local_99;
  Write<double> coords_1d_w;
  Write<signed_char> local_78;
  type_conflict1 f;
  
  coords_1d_w.shared_alloc_.alloc = (Alloc *)origin.super_Few<double,_3>.array_[0];
  coords_1d_w.shared_alloc_.direct_ptr = (void *)origin.super_Few<double,_3>.array_[1];
  f.coords.write_.shared_alloc_.alloc = (Alloc *)direction.super_Few<double,_3>.array_[0];
  f.coords.write_.shared_alloc_.direct_ptr = (void *)direction.super_Few<double,_3>.array_[1];
  f.direction.super_Few<double,_3>.array_[0] = direction.super_Few<double,_3>.array_[2];
  dVar4 = origin.super_Few<double,_3>.array_[0] * direction.super_Few<double,_3>.array_[0];
  for (lVar2 = 1; lVar2 != 3; lVar2 = lVar2 + 1) {
    dVar4 = dVar4 + (double)(&coords_1d_w.shared_alloc_.alloc)[lVar2] *
                    f.direction.super_Few<double,_3>.array_[lVar2 + -2];
  }
  pAVar1 = ((coords.write_.shared_alloc_.direct_ptr)->shared_alloc_).alloc;
  if (((ulong)pAVar1 & 1) == 0) {
    sVar3 = pAVar1->size;
  }
  else {
    sVar3 = (ulong)pAVar1 >> 3;
  }
  size_in = divide_no_remainder<int>((int)(sVar3 >> 3),3);
  std::__cxx11::string::string((string *)&f,"",&local_99);
  Write<double>::Write(&coords_1d_w,size_in,(string *)&f);
  std::__cxx11::string::~string((string *)&f);
  Write<double>::Write((Write<double> *)&f,coords.write_.shared_alloc_.direct_ptr);
  f.direction.super_Few<double,_3>.array_[2] = direction.super_Few<double,_3>.array_[2];
  f.direction.super_Few<double,_3>.array_[0] = direction.super_Few<double,_3>.array_[0];
  f.direction.super_Few<double,_3>.array_[1] = direction.super_Few<double,_3>.array_[1];
  f.offset = dVar4;
  Write<double>::Write(&f.coords_1d_w,&coords_1d_w);
  parallel_for<Omega_h::get_linear_scatter_coords<3>(Omega_h::Read<double>,Omega_h::Vector<3>,Omega_h::Vector<3>)::_lambda(int)_1_&>
            (size_in,&f);
  Write<double>::Write(&local_78,(Write<signed_char> *)&coords_1d_w);
  Read<double>::Read((Read<signed_char> *)coords.write_.shared_alloc_.alloc,
                     (Write<double> *)&local_78);
  Write<double>::~Write((Write<double> *)&local_78);
  get_linear_scatter_coords<3>(Omega_h::Read<double>,Omega_h::Vector<3>,Omega_h::Vector<3>)::
  {lambda(int)#1}::~Vector((_lambda_int__1_ *)&f);
  Write<double>::~Write(&coords_1d_w);
  RVar5.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar5.write_.shared_alloc_.alloc = coords.write_.shared_alloc_.alloc;
  return (Reals)RVar5.write_.shared_alloc_;
}

Assistant:

Reals get_linear_scatter_coords(
    Reals coords, Vector<dim> direction, Vector<dim> origin) {
  auto offset = origin * direction;
  auto n = divide_no_remainder(coords.size(), dim);
  auto coords_1d_w = Write<Real>(n);
  auto f = OMEGA_H_LAMBDA(LO i) {
    auto x = get_vector<dim>(coords, i);
    auto d = x * direction - offset;
    coords_1d_w[i] = d;
  };
  parallel_for(n, f);
  return coords_1d_w;
}